

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

void __thiscall CTcSymLocalBase::check_local_references(CTcSymLocalBase *this)

{
  ushort uVar1;
  tc_severity_t severity;
  int err;
  bool bVar2;
  
  if (this->ctx_orig_ != (CTcSymLocal *)0x0) {
    return;
  }
  uVar1 = *(ushort *)&this->field_0x64;
  if ((uVar1 & 0x40) == 0) {
    if ((uVar1 & 0x8f) != 0) {
      if ((uVar1 & 0x40) == 0) {
        bVar2 = (uVar1 & 0xf) == 0;
        err = 0x2d15;
        if (bVar2) {
          err = 0x2d0f;
        }
        severity = bVar2 + TC_SEV_PEDANTIC;
        goto LAB_00236a5f;
      }
      goto LAB_00236a48;
    }
    err = 0x2d0d;
  }
  else {
LAB_00236a48:
    if ((uVar1 & 0x8f) != 0) {
      return;
    }
    err = 0x2d0e;
  }
  severity = TC_SEV_WARNING;
LAB_00236a5f:
  CTcMain::log_error(G_tcmain,this->src_desc_,this->src_linenum_,severity,err,
                     (ulong)(uint)(this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                                  super_CVmHashEntry.len_,
                     (this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                     super_CVmHashEntry.str_);
  return;
}

Assistant:

void CTcSymLocalBase::check_local_references()
{
    int err;
    tc_severity_t sev = TC_SEV_WARNING;
    
    /* 
     *   if this isn't an original, but is simply a copy of a variable
     *   inherited from an enclosing scope (such as into an anonymous
     *   function), don't bother even checking for errors - we'll let the
     *   original symbol take care of reporting its own errors 
     */
    if (ctx_orig_ != 0)
        return;

    /* 
     *   Note if this is some kind of parameter.  Some parameters are
     *   represented as locals: varargs-list parameters, optional parameters,
     *   and named parameters.  We need to check for those kinds of
     *   parameters specifically because they otherwise look like regular
     *   local variables.  
     */
    int param = (is_param() || is_list_param()
                 || is_opt_param() || is_named_param());

    /* 
     *   If it's unreferenced or unassigned (or both), log an error; note
     *   that a formal parameter is always assigned, since the value is
     *   assigned by the caller.  
     */
    if (!get_val_used() && !get_val_assigned() && !param)
    {
        /* this is a regular local that was never assigned or referenced */
        err = TCERR_UNREFERENCED_LOCAL;
    }
    else if (!get_val_used())
    {
        if (param)
        {
            /* it's a parameter - generate only a pendantic error */
            sev = TC_SEV_PEDANTIC;
            err = TCERR_UNREFERENCED_PARAM;
        }
        else
        {
            /* 
             *   this is a regular local with a value that was assigned and
             *   never used 
             */
            err = TCERR_UNUSED_LOCAL_ASSIGNMENT;
        }
    }
    else if (!get_val_assigned() && !param)
    {
        /* it's used but never assigned */
        err = TCERR_UNASSIGNED_LOCAL;
    }
    else
    {
        /* no error */
        return;
    }

    /* 
     *   display the warning message, showing the error location as the
     *   source line where the local was defined 
     */
    G_tcmain->log_error(get_src_desc(), get_src_linenum(),
                        sev, err, (int)get_sym_len(), get_sym());
}